

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_tga.c
# Opt level: O0

gdImagePtr gdImageCreateFromTga(FILE *fp)

{
  gdIOCtx *ctx;
  gdIOCtx *in;
  gdImagePtr image;
  FILE *fp_local;
  
  ctx = gdNewFileCtx(fp);
  if (ctx == (gdIOCtx *)0x0) {
    fp_local = (FILE *)0x0;
  }
  else {
    fp_local = (FILE *)gdImageCreateFromTgaCtx(ctx);
    (*ctx->gd_free)(ctx);
  }
  return (gdImagePtr)fp_local;
}

Assistant:

BGD_DECLARE(gdImagePtr) gdImageCreateFromTga(FILE *fp)
{
	gdImagePtr image;
	gdIOCtx* in = gdNewFileCtx(fp);
	if (in == NULL) return NULL;
	image = gdImageCreateFromTgaCtx(in);
	in->gd_free( in );
	return image;
}